

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O1

MPP_RET hal_h265e_vepu510_status_check(H265eV510RegSet *regs)

{
  MPP_RET MVar1;
  
  if ((((uint)(regs->reg_ctl).int_sta & 2) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","lkt_done finish",(char *)0x0);
  }
  if ((((uint)(regs->reg_ctl).int_sta & 1) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","enc_done finish",(char *)0x0);
  }
  if ((((uint)(regs->reg_ctl).int_sta & 8) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","enc_slice finsh",(char *)0x0);
  }
  if ((((uint)(regs->reg_ctl).int_sta & 4) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","safe clear finsh",(char *)0x0);
  }
  MVar1 = MPP_OK;
  if (((uint)(regs->reg_ctl).int_sta & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","bit stream overflow","hal_h265e_vepu510_status_check");
    MVar1 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","bus write full","hal_h265e_vepu510_status_check");
    MVar1 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","bus error","hal_h265e_vepu510_status_check");
    MVar1 = MPP_NOK;
  }
  if (((regs->reg_ctl).int_sta.field_0x1 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","wdg timeout","hal_h265e_vepu510_status_check");
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_h265e_vepu510_status_check(H265eV510RegSet *regs)
{
    MPP_RET ret = MPP_OK;

    if (regs->reg_ctl.int_sta.lkt_node_done_sta)
        hal_h265e_dbg_detail("lkt_done finish");

    if (regs->reg_ctl.int_sta.enc_done_sta)
        hal_h265e_dbg_detail("enc_done finish");

    if (regs->reg_ctl.int_sta.vslc_done_sta)
        hal_h265e_dbg_detail("enc_slice finsh");

    if (regs->reg_ctl.int_sta.sclr_done_sta)
        hal_h265e_dbg_detail("safe clear finsh");

    if (regs->reg_ctl.int_sta.vbsf_oflw_sta) {
        mpp_err_f("bit stream overflow");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.vbuf_lens_sta) {
        mpp_err_f("bus write full");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.enc_err_sta) {
        mpp_err_f("bus error");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.wdg_sta) {
        mpp_err_f("wdg timeout");
        ret = MPP_NOK;
    }

    return ret;
}